

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,Privkey *privkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  Pubkey local_50;
  ByteData *local_28;
  ByteData *finterprint_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list_local;
  Privkey *privkey_local;
  KeyData *this_local;
  
  local_28 = finterprint;
  finterprint_local = (ByteData *)child_num_list;
  child_num_list_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)privkey;
  privkey_local = (Privkey *)this;
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_,(Privkey *)child_num_list_local);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->path_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)finterprint_local);
  ByteData::ByteData(&this->fingerprint_,local_28);
  Privkey::GetPubkey(&local_50,(Privkey *)child_num_list_local);
  Pubkey::operator=(&this->pubkey_,&local_50);
  Pubkey::~Pubkey(&local_50);
  return;
}

Assistant:

KeyData::KeyData(
    const Privkey& privkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : privkey_(privkey), path_(child_num_list), fingerprint_(finterprint) {
  pubkey_ = privkey.GetPubkey();
}